

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int av1_write_uleb_obu_size_unsafe(size_t obu_payload_size,uint8_t *dest)

{
  int iVar1;
  size_t coded_obu_size;
  
  coded_obu_size = 0;
  iVar1 = aom_uleb_encode(obu_payload_size,4,dest,&coded_obu_size);
  return (int)(iVar1 != 0);
}

Assistant:

static int av1_write_uleb_obu_size_unsafe(size_t obu_payload_size,
                                          uint8_t *dest) {
  size_t coded_obu_size = 0;

  if (aom_uleb_encode(obu_payload_size, sizeof(uint32_t), dest,
                      &coded_obu_size) != 0) {
    return AOM_CODEC_ERROR;
  }

  return AOM_CODEC_OK;
}